

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (long *__result,long *__a,long *__b,long *__c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *__a;
  lVar2 = *__b;
  lVar3 = *__c;
  if (lVar1 < lVar2) {
    if (lVar2 < lVar3) {
LAB_004da703:
      lVar1 = *__result;
      lVar2 = __result[1];
      lVar3 = __b[1];
      *__result = *__b;
      __result[1] = lVar3;
      *__b = lVar1;
      __b[1] = lVar2;
      return;
    }
    if (lVar1 < lVar3) {
LAB_004da6e6:
      lVar1 = *__result;
      lVar2 = __result[1];
      lVar3 = __c[1];
      *__result = *__c;
      __result[1] = lVar3;
      *__c = lVar1;
      __c[1] = lVar2;
      return;
    }
  }
  else if (lVar3 <= lVar1) {
    if (lVar2 < lVar3) goto LAB_004da6e6;
    goto LAB_004da703;
  }
  lVar1 = *__result;
  lVar2 = __result[1];
  lVar3 = __a[1];
  *__result = *__a;
  __result[1] = lVar3;
  *__a = lVar1;
  __a[1] = lVar2;
  return;
}

Assistant:

bool operator >  (const Var& n) const { return( _label >  n._label ); }